

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O1

TestLog * tcu::operator<<(TestLog *log,exception *e)

{
  ostringstream *this;
  char *__s;
  size_t sVar1;
  TestLog *pTVar2;
  undefined1 local_190 [384];
  
  this = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  if (__s == (char *)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(local_190._8_8_ + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar1);
  }
  pTVar2 = MessageBuilder::operator<<
                     ((MessageBuilder *)local_190,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  return pTVar2;
}

Assistant:

inline TestLog& operator<< (TestLog& log, const std::exception& e)
{
	// \todo [2012-10-18 pyry] Print type info?
	return log << TestLog::Message << e.what() << TestLog::EndMessage;
}